

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdAddTapBranchByScriptTree(void *handle,void *tree_handle,void *branch_tree)

{
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *pvVar1;
  reference branch;
  reference this;
  reference this_00;
  allocator local_99;
  TapBranch local_98;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&local_98,"TapscriptTree",&local_99);
  cfd::capi::CheckBuffer(tree_handle,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"TapscriptTree",&local_99);
  cfd::capi::CheckBuffer(branch_tree,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  pvVar1 = *(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
            ((long)branch_tree + 0x18);
  if ((pvVar1->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (pvVar1->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    branch = std::
             vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::at
                       (*(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                          **)((long)branch_tree + 0x10),0);
  }
  else {
    branch = (reference)
             std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at(pvVar1,0);
  }
  pvVar1 = *(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
            ((long)tree_handle + 0x18);
  if ((pvVar1->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (pvVar1->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    this_00 = std::
              vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
              at(*(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                   **)((long)tree_handle + 0x10),0);
    cfd::core::TaprootScriptTree::AddBranch(this_00,&branch->super_TapBranch);
  }
  else {
    this = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at(pvVar1,0);
    cfd::core::TapBranch::ToString_abi_cxx11_((string *)&local_98,this);
    std::__cxx11::string::~string((string *)&local_98);
    if (local_98._8_8_ == 0) {
      cfd::core::TapBranch::TapBranch(&local_98,&branch->super_TapBranch);
      cfd::core::TapBranch::operator=(this,&local_98);
      cfd::core::TapBranch::~TapBranch(&local_98);
    }
    else {
      cfd::core::TapBranch::AddBranch(this,&branch->super_TapBranch);
    }
  }
  return 0;
}

Assistant:

int CfdAddTapBranchByScriptTree(
    void* handle, void* tree_handle, void* branch_tree) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CheckBuffer(branch_tree, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    CfdCapiTapscriptTree* branch_buffer =
        static_cast<CfdCapiTapscriptTree*>(branch_tree);

    TapBranch* src_tree;
    if (!branch_buffer->branch_buffer->empty()) {
      src_tree = &branch_buffer->branch_buffer->at(0);
    } else {
      src_tree = &branch_buffer->tree_buffer->at(0);
    }

    if (!buffer->branch_buffer->empty()) {
      auto& branch = buffer->branch_buffer->at(0);
      if (branch.ToString().empty()) {
        branch = TapBranch(*src_tree);  // override
      } else {
        branch.AddBranch(*src_tree);
      }
    } else {
      auto& dest_tree = buffer->tree_buffer->at(0);
      dest_tree.AddBranch(*src_tree);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}